

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O1

void __thiscall brynet::net::TcpService::stopWorkerThread(TcpService *this)

{
  mutex *__mutex;
  pointer psVar1;
  int iVar2;
  undefined8 uVar3;
  pointer psVar4;
  
  __mutex = &this->mServiceGuard;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mIOLoopGuard);
    if (iVar2 == 0) {
      *(this->mRunIOLoop).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = false;
      psVar1 = (this->mIOLoopDatas).
               super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar4 = (this->mIOLoopDatas).
                    super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1
          ) {
        EventLoop::wakeup((((psVar4->
                            super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr)->mEventLoop).
                          super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
        if ((((((psVar4->super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->mIOThread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_M_id)._M_thread != 0) {
          std::thread::join();
        }
      }
      std::
      vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
      ::clear(&this->mIOLoopDatas);
      pthread_mutex_unlock((pthread_mutex_t *)&this->mIOLoopGuard);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return;
    }
  }
  else {
    iVar2 = std::__throw_system_error(iVar2);
  }
  uVar3 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

void TcpService::stopWorkerThread()
{
    std::lock_guard<std::mutex> lck(mServiceGuard);
    std::lock_guard<std::mutex> lock(mIOLoopGuard);

    *mRunIOLoop = false;

    for (const auto& v : mIOLoopDatas)
    {
        v->getEventLoop()->wakeup();
        try
        {
            if (v->getIOThread()->joinable())
            {
                v->getIOThread()->join();
            }
        }
        catch (...)
        {
        }
    }
    mIOLoopDatas.clear();
}